

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O1

void __thiscall imrt::ACS::calculateProbability(ACS *this)

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  key_type_conflict local_54;
  double local_50;
  double local_48;
  long local_40;
  double local_38;
  
  iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
  if (0 < iVar1) {
    local_40 = 0;
    do {
      lVar5 = local_40;
      local_54 = 0;
      if (0 < (this->super_ACO).max_apertures) {
        do {
          iVar1 = Collimator::getIntensityLevelSize((this->super_ACO).collimator);
          if (iVar1 < 1) {
            local_48 = 0.0;
          }
          else {
            local_48 = 0.0;
            lVar3 = 0;
            do {
              local_50 = pow((this->super_ACO).ipheromone.
                             super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar5].p[local_54][lVar3],
                             (this->super_ACO).alpha);
              dVar6 = pow((this->super_ACO).iheuristic.
                          super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar5].p[local_54][lVar3],
                          (this->super_ACO).beta);
              local_48 = local_48 + dVar6 * local_50;
              lVar3 = lVar3 + 1;
              iVar1 = Collimator::getIntensityLevelSize((this->super_ACO).collimator);
            } while (lVar3 < iVar1);
          }
          iVar1 = Collimator::getIntensityLevelSize((this->super_ACO).collimator);
          if (0 < iVar1) {
            local_50 = 0.0;
            lVar3 = 0;
            do {
              local_38 = pow((this->super_ACO).ipheromone.
                             super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar5].p[local_54][lVar3],
                             (this->super_ACO).alpha);
              dVar6 = pow((this->super_ACO).iheuristic.
                          super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar5].p[local_54][lVar3],
                          (this->super_ACO).beta);
              local_50 = local_50 + (dVar6 * local_38) / local_48;
              (this->super_ACO).iprobability.
              super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5].p[local_54][lVar3] = local_50;
              lVar3 = lVar3 + 1;
              iVar1 = Collimator::getIntensityLevelSize((this->super_ACO).collimator);
            } while (lVar3 < iVar1);
          }
          iVar1 = Collimator::getXdim((this->super_ACO).collimator);
          if (0 < iVar1) {
            lVar3 = 0;
            do {
              iVar1 = Collimator::getReferenceSize((this->super_ACO).collimator);
              if (iVar1 < 1) {
                local_48 = 0.0;
              }
              else {
                local_48 = 0.0;
                lVar4 = 0;
                do {
                  pmVar2 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((this->super_ACO).pheromone.
                                        super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_54)
                  ;
                  local_50 = pow(pmVar2->p[lVar3][lVar4],(this->super_ACO).alpha);
                  pmVar2 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((this->super_ACO).heuristic.
                                        super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_54)
                  ;
                  dVar6 = pow(pmVar2->p[lVar3][lVar4],(this->super_ACO).beta);
                  local_48 = local_48 + dVar6 * local_50;
                  lVar4 = lVar4 + 1;
                  iVar1 = Collimator::getReferenceSize((this->super_ACO).collimator);
                } while (lVar4 < iVar1);
              }
              iVar1 = Collimator::getReferenceSize((this->super_ACO).collimator);
              if (0 < iVar1) {
                local_50 = 0.0;
                lVar4 = 0;
                do {
                  pmVar2 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((this->super_ACO).pheromone.
                                        super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_54)
                  ;
                  local_38 = pow(pmVar2->p[lVar3][lVar4],(this->super_ACO).alpha);
                  pmVar2 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((this->super_ACO).heuristic.
                                        super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_54)
                  ;
                  dVar6 = pow(pmVar2->p[lVar3][lVar4],(this->super_ACO).beta);
                  local_50 = (dVar6 * local_38) / local_48 + local_50;
                  pmVar2 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((this->super_ACO).probability.
                                        super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_54)
                  ;
                  pmVar2->p[lVar3][lVar4] = local_50;
                  pmVar2 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((this->super_ACO).probability.
                                        super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_54)
                  ;
                  local_50 = pmVar2->p[lVar3][lVar4];
                  lVar4 = lVar4 + 1;
                  iVar1 = Collimator::getReferenceSize((this->super_ACO).collimator);
                } while (lVar4 < iVar1);
              }
              lVar3 = lVar3 + 1;
              iVar1 = Collimator::getXdim((this->super_ACO).collimator);
            } while (lVar3 < iVar1);
          }
          local_54 = local_54 + 1;
        } while (local_54 < (this->super_ACO).max_apertures);
      }
      lVar5 = local_40 + 1;
      iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
      local_40 = lVar5;
    } while (lVar5 < iVar1);
  }
  return;
}

Assistant:

void ACS::calculateProbability (){
    double sum, aux;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++ ){
        // Intensity probability
        sum = 0;
        for (int i=0; i< collimator.getIntensityLevelSize(); i++) {
          sum = sum + pow(ipheromone[s](a,i),alpha)*pow(iheuristic[s](a,i),beta);
        }
        aux=0;
        for (int i=0; i< collimator.getIntensityLevelSize(); i++) {
          iprobability[s](a,i) = aux + (pow(ipheromone[s](a,i),alpha)*pow(iheuristic[s](a,i),beta)/sum);
          aux = iprobability[s](a,i);
        }
        // Aperture probability
        for (int j = 0; j < collimator.getXdim(); j++) {
          sum = 0;
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            sum = sum + pow(pheromone[s][a](j,r),alpha)*pow(heuristic[s][a](j,r),beta);
          }
          aux = 0;
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            probability[s][a](j,r) = aux + pow(pheromone[s][a](j,r),alpha)*pow(heuristic[s][a](j,r),beta) / sum;;
            aux  = probability[s][a](j,r);
          }
        }
      }
    }
  }